

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void set_inter_tx_size(MB_MODE_INFO *mbmi,int stride_log2,int tx_w_log2,int tx_h_log2,int min_txs,
                      int split_size,int txs,int blk_row,int blk_col)

{
  int iVar1;
  int iVar2;
  int idx;
  int iVar3;
  int idy;
  int iVar4;
  
  iVar1 = tx_size_high_unit[(uint)split_size];
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + tx_size_high_unit[(uint)min_txs]) {
    iVar2 = tx_size_wide_unit[(uint)split_size];
    for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + tx_size_wide_unit[(uint)min_txs]) {
      mbmi->inter_tx_size
      [(iVar3 + blk_col >> ((byte)tx_w_log2 & 0x1f)) +
       ((iVar4 + blk_row >> ((byte)tx_h_log2 & 0x1f)) << ((byte)stride_log2 & 0x1f))] = (TX_SIZE)txs
      ;
    }
  }
  return;
}

Assistant:

static inline void set_inter_tx_size(MB_MODE_INFO *mbmi, int stride_log2,
                                     int tx_w_log2, int tx_h_log2, int min_txs,
                                     int split_size, int txs, int blk_row,
                                     int blk_col) {
  for (int idy = 0; idy < tx_size_high_unit[split_size];
       idy += tx_size_high_unit[min_txs]) {
    for (int idx = 0; idx < tx_size_wide_unit[split_size];
         idx += tx_size_wide_unit[min_txs]) {
      const int index = (((blk_row + idy) >> tx_h_log2) << stride_log2) +
                        ((blk_col + idx) >> tx_w_log2);
      mbmi->inter_tx_size[index] = txs;
    }
  }
}